

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813_9.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaANCF_3813_9::ComputeNF
          (ChElementHexaANCF_3813_9 *this,double U,double V,double W,ChVectorDynamic<> *Qi,
          double *detJ,ChVectorDynamic<> *F,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  Scalar *scalar;
  long start;
  int i;
  long index;
  double dVar1;
  ShapeVector N;
  VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> local_100;
  StorageBaseType local_c8 [56];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
  local_90;
  
  ShapeFunctions(this,&N,U,V,W);
  dVar1 = Calc_detJ0(this,U,V,W);
  *detJ = dVar1;
  start = 0;
  *detJ = dVar1 * (this->m_dimensions).m_data[0] * (this->m_dimensions).m_data[1] *
                  (this->m_dimensions).m_data[2] * 0.125;
  for (index = 0; index != 0xb; index = index + 1) {
    scalar = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>,_1> *)&N,index);
    Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_c8,F,0,3);
    Eigen::operator*(&local_90,scalar,local_c8);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              (&local_100,Qi,start,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>const>>
              (&local_100.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,
               &local_90);
    start = start + 3;
  }
  return;
}

Assistant:

void ChElementHexaANCF_3813_9::ComputeNF(
    const double U,              // parametric coordinate in volume
    const double V,              // parametric coordinate in volume
    const double W,              // parametric coordinate in volume
    ChVectorDynamic<>& Qi,       // Return result of N'*F  here, maybe with offset block_offset
    double& detJ,                // Return det(J) here
    const ChVectorDynamic<>& F,  // Input F vector, size is = n.field coords.
    ChVectorDynamic<>* state_x,  // if != 0, update state (pos. part) to this, then evaluate Q
    ChVectorDynamic<>* state_w   // if != 0, update state (speed part) to this, then evaluate Q
) {
    ShapeVector N;
    ShapeFunctions(N, U, V, W);

    detJ = Calc_detJ0(U, V, W);
    detJ *= m_dimensions.x() * m_dimensions.y() * m_dimensions.z() / 8;

    for (int i = 0; i < 11; i++) {
        Qi.segment(3 * i, 3) = N(i) * F.segment(0, 3);
    }
}